

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O1

CURLcode httpchunk_readwrite(Curl_easy *data,Curl_chunker *ch,Curl_cwriter *cw_next,char *buf,
                            size_t blen,size_t *pconsumed)

{
  dynbuf *s;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  CURLcode CVar4;
  CURLofft CVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 uVar8;
  int iVar9;
  CURLcode unaff_EBP;
  char *endptr;
  char *local_38;
  
  *pconsumed = 0;
  if (ch->state != CHUNK_DONE) {
    if (ch->state == CHUNK_FAILED) {
LAB_006413a4:
      return CURLE_RECV_ERROR;
    }
    if ((((data->set).field_0x8be & 8) != 0) && ((ch->field_0x42 & 1) == 0)) {
      if (cw_next == (Curl_cwriter *)0x0) {
        unaff_EBP = Curl_client_write(data,1,buf,blen);
      }
      else {
        unaff_EBP = Curl_cwriter_write(data,cw_next,1,buf,blen);
      }
      if (unaff_EBP != CURLE_OK) {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_PASSTHRU_ERROR;
        return unaff_EBP;
      }
    }
    if (blen != 0) {
      s = &ch->trailer;
      do {
        switch(ch->state) {
        case CHUNK_HEX:
          bVar2 = *buf;
          if (((byte)(bVar2 - 0x30) < 10) ||
             ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            bVar1 = ch->hexindex;
            if (0xf < (ulong)bVar1) {
              Curl_failf(data,"chunk hex-length longer than %d",0x10);
              uVar8 = 0x100000009;
              goto LAB_006413e3;
            }
            ch->hexindex = bVar1 + 1;
            ch->hexbuffer[bVar1] = bVar2;
            goto LAB_00641332;
          }
          if ((ulong)ch->hexindex == 0) {
            Curl_failf(data,"chunk hex-length char not a hex digit: 0x%x",(ulong)(uint)(int)*buf);
LAB_0064135e:
            bVar3 = false;
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_ILLEGAL_HEX;
            unaff_EBP = CURLE_RECV_ERROR;
          }
          else {
            ch->hexbuffer[ch->hexindex] = '\0';
            CVar5 = curlx_strtoofft(ch->hexbuffer,&local_38,0x10,&ch->datasize);
            if (CVar5 != CURL_OFFT_OK) {
              Curl_failf(data,"chunk hex-length not valid: \'%s\'",ch->hexbuffer);
              goto LAB_0064135e;
            }
            ch->state = CHUNK_LF;
            bVar3 = true;
          }
          if (!bVar3) {
            return unaff_EBP;
          }
          break;
        case CHUNK_LF:
          if (*buf == 10) {
            ch->state = (uint)(ch->datasize == 0) * 3 + CHUNK_DATA;
          }
          goto LAB_00641332;
        case CHUNK_DATA:
          sVar7 = blen;
          if (ch->datasize < (long)blen) {
            sVar7 = curlx_sotouz(ch->datasize);
          }
          if (((*(ulong *)&(data->set).field_0x8ba & 0x800000000) == 0) &&
             ((ch->field_0x42 & 1) == 0)) {
            if (cw_next == (Curl_cwriter *)0x0) {
              CVar4 = Curl_client_write(data,1,buf,sVar7);
            }
            else {
              CVar4 = Curl_cwriter_write(data,cw_next,1,buf,sVar7);
            }
            if (CVar4 != CURLE_OK) {
              uVar8 = 0x600000009;
LAB_00641402:
              ch->state = (int)uVar8;
              ch->last_code = (int)((ulong)uVar8 >> 0x20);
              return CVar4;
            }
          }
          *pconsumed = *pconsumed + sVar7;
          buf = (char *)((byte *)buf + sVar7);
          blen = blen - sVar7;
          ch->datasize = ch->datasize - sVar7;
          if (ch->datasize == 0) {
            ch->state = CHUNK_POSTLF;
          }
          break;
        case CHUNK_POSTLF:
          if (*buf != 0xd) {
            if (*buf != 10) goto LAB_006413b5;
            bVar2 = ch->field_0x42;
            ch->hexindex = '\0';
            ch->state = CHUNK_HEX;
            ch->last_code = CHUNKE_OK;
            Curl_dyn_reset(s);
            ch->field_0x42 = ch->field_0x42 & 0xfe | bVar2 & 1;
          }
          goto LAB_00641332;
        case CHUNK_STOP:
          if (*buf == 10) {
            ch->datasize = blen - 1;
            ch->state = CHUNK_DONE;
            return CURLE_OK;
          }
LAB_006413b5:
          uVar8 = 0x300000009;
LAB_006413e3:
          ch->state = (int)uVar8;
          ch->last_code = (int)((ulong)uVar8 >> 0x20);
          return CURLE_RECV_ERROR;
        case CHUNK_TRAILER:
          if ((*buf == 0xd) || (*buf == 10)) {
            pcVar6 = Curl_dyn_ptr(s);
            if (pcVar6 == (char *)0x0) {
              ch->state = CHUNK_TRAILER_POSTCR;
              iVar9 = 4;
            }
            else {
              CVar4 = Curl_dyn_addn(s,"\r\n",2);
              if (CVar4 == CURLE_OK) {
                pcVar6 = Curl_dyn_ptr(s);
                sVar7 = Curl_dyn_len(s);
                if ((*(ulong *)&(data->set).field_0x8ba & 0x800000000) == 0) {
                  if (cw_next == (Curl_cwriter *)0x0) {
                    CVar4 = Curl_client_write(data,0x44,pcVar6,sVar7);
                  }
                  else {
                    CVar4 = Curl_cwriter_write(data,cw_next,0x44,pcVar6,sVar7);
                  }
                  if (CVar4 != CURLE_OK) {
                    ch->state = CHUNK_FAILED;
                    ch->last_code = CHUNKE_PASSTHRU_ERROR;
                    iVar9 = 1;
                    unaff_EBP = CVar4;
                    goto LAB_00641322;
                  }
                }
                Curl_dyn_reset(s);
                ch->state = CHUNK_TRAILER_CR;
                iVar9 = (uint)(*buf == 10) << 2;
              }
              else {
                ch->state = CHUNK_FAILED;
                ch->last_code = CHUNKE_OUT_OF_MEMORY;
                iVar9 = 1;
                unaff_EBP = CVar4;
              }
            }
LAB_00641322:
            if (iVar9 != 0) {
              if (iVar9 != 4) {
                return unaff_EBP;
              }
              break;
            }
          }
          else {
            CVar4 = Curl_dyn_addn(s,buf,1);
            if (CVar4 != CURLE_OK) {
              uVar8 = 0x500000009;
              goto LAB_00641402;
            }
          }
          goto LAB_00641332;
        case CHUNK_TRAILER_CR:
          if (*buf != 10) goto LAB_006413b5;
          ch->state = CHUNK_TRAILER_POSTCR;
LAB_00641332:
          buf = (char *)((byte *)buf + 1);
          blen = blen - 1;
          break;
        case CHUNK_TRAILER_POSTCR:
          bVar2 = *buf;
          if ((bVar2 == 10) || (bVar2 == 0xd)) {
            blen = blen - (bVar2 == 0xd);
            buf = (char *)((byte *)buf + (bVar2 == 0xd));
            ch->state = CHUNK_STOP;
          }
          else {
            ch->state = CHUNK_TRAILER;
          }
          break;
        case CHUNK_DONE:
          goto LAB_006413a4;
        case CHUNK_FAILED:
          goto LAB_006413a4;
        }
      } while (blen != 0);
    }
  }
LAB_006413a4:
  return CURLE_OK;
}

Assistant:

static CURLcode httpchunk_readwrite(struct Curl_easy *data,
                                    struct Curl_chunker *ch,
                                    struct Curl_cwriter *cw_next,
                                    const char *buf, size_t blen,
                                    size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  size_t piece;

  *pconsumed = 0; /* nothing's written yet */
  /* first check terminal states that will not progress anywhere */
  if(ch->state == CHUNK_DONE)
    return CURLE_OK;
  if(ch->state == CHUNK_FAILED)
    return CURLE_RECV_ERROR;

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length */
  if(data->set.http_te_skip && !ch->ignore_body) {
    if(cw_next)
      result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY, buf, blen);
    else
      result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)buf, blen);
    if(result) {
      ch->state = CHUNK_FAILED;
      ch->last_code = CHUNKE_PASSTHRU_ERROR;
      return result;
    }
  }

  while(blen) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(ISXDIGIT(*buf)) {
        if(ch->hexindex >= CHUNK_MAXNUM_LEN) {
          failf(data, "chunk hex-length longer than %d", CHUNK_MAXNUM_LEN);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_TOO_LONG_HEX; /* longer than we support */
          return CURLE_RECV_ERROR;
        }
        ch->hexbuffer[ch->hexindex++] = *buf;
        buf++;
        blen--;
      }
      else {
        char *endptr;
        if(0 == ch->hexindex) {
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          failf(data, "chunk hex-length char not a hex digit: 0x%x", *buf);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }

        /* blen and buf are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;
        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize)) {
          failf(data, "chunk hex-length not valid: '%s'", ch->hexbuffer);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*buf == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else
          ch->state = CHUNK_DATA;
      }

      buf++;
      blen--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'blen' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = blen;
      if(ch->datasize < (curl_off_t)blen)
        piece = curlx_sotouz(ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !ch->ignore_body) {
        if(cw_next)
          result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY,
                                      buf, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                                    (char *)buf, piece);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_PASSTHRU_ERROR;
          return result;
        }
      }

      *pconsumed += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      buf += piece;    /* move read pointer forward */
      blen -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*buf == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_reset(data, ch, ch->ignore_body);
      }
      else if(*buf != 0x0d) {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      buf++;
      blen--;
      break;

    case CHUNK_TRAILER:
      if((*buf == 0x0d) || (*buf == 0x0a)) {
        char *tr = Curl_dyn_ptr(&ch->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_addn(&ch->trailer, (char *)STRCONST("\x0d\x0a"));
          if(result) {
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_OUT_OF_MEMORY;
            return result;
          }
          tr = Curl_dyn_ptr(&ch->trailer);
          trlen = Curl_dyn_len(&ch->trailer);
          if(!data->set.http_te_skip) {
            if(cw_next)
              result = Curl_cwriter_write(data, cw_next,
                                          CLIENTWRITE_HEADER|
                                          CLIENTWRITE_TRAILER,
                                          tr, trlen);
            else
              result = Curl_client_write(data,
                                         CLIENTWRITE_HEADER|
                                         CLIENTWRITE_TRAILER,
                                         tr, trlen);
            if(result) {
              ch->state = CHUNK_FAILED;
              ch->last_code = CHUNKE_PASSTHRU_ERROR;
              return result;
            }
          }
          Curl_dyn_reset(&ch->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*buf == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&ch->trailer, buf, 1);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return result;
        }
      }
      buf++;
      blen--;
      break;

    case CHUNK_TRAILER_CR:
      if(*buf == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        buf++;
        blen--;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*buf != 0x0d) && (*buf != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*buf == 0x0d) {
        /* skip if CR */
        buf++;
        blen--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*buf == 0x0a) {
        blen--;
        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->datasize = blen;
        ch->state = CHUNK_DONE;
        return CURLE_OK;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
    case CHUNK_DONE:
      return CURLE_OK;

    case CHUNK_FAILED:
      return CURLE_RECV_ERROR;
    }

  }
  return CURLE_OK;
}